

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall
QSplitterPrivate::addContribution
          (QSplitterPrivate *this,int index,int *min,int *max,bool mayCollapse)

{
  Orientation OVar1;
  QSplitterLayoutStruct *pQVar2;
  ulong uVar3;
  int iVar4;
  Representation RVar5;
  ulong uVar6;
  undefined8 uVar7;
  QSize QVar8;
  
  pQVar2 = (this->list).d.ptr[index];
  if ((pQVar2->widget->data->widget_attributes & 0x10000) == 0) {
    if ((((pQVar2->handle->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
      OVar1 = this->orient;
      uVar6 = (**(code **)(*(long *)&pQVar2->handle->super_QWidget + 0x70))();
      uVar3 = uVar6 >> 0x20;
      if (OVar1 == Horizontal) {
        uVar3 = uVar6;
      }
      *min = *min + (int)uVar3;
      OVar1 = this->orient;
      uVar7 = (**(code **)(*(long *)&pQVar2->handle->super_QWidget + 0x70))();
      iVar4 = (int)((ulong)uVar7 >> 0x20);
      if (OVar1 == Horizontal) {
        iVar4 = (int)uVar7;
      }
      *max = *max + iVar4;
    }
    if ((mayCollapse) || ((pQVar2->field_0x14 & 1) == 0)) {
      QVar8 = qSmartMinSize(pQVar2->widget);
      RVar5 = QVar8.ht.m_i;
      if (this->orient == Horizontal) {
        RVar5 = QVar8.wd.m_i;
      }
      *min = *min + RVar5.m_i;
    }
    QVar8 = qSmartMaxSize(pQVar2->widget,(Alignment)0x0);
    RVar5 = QVar8.ht.m_i;
    if (this->orient == Horizontal) {
      RVar5 = QVar8.wd.m_i;
    }
    *max = *max + RVar5.m_i;
  }
  return;
}

Assistant:

void QSplitterPrivate::addContribution(int index, int *min, int *max, bool mayCollapse) const
{
    QSplitterLayoutStruct *s = list.at(index);
    if (!s->widget->isHidden()) {
        if (!s->handle->isHidden()) {
            *min += s->getHandleSize(orient);
            *max += s->getHandleSize(orient);
        }
        if (mayCollapse || !s->collapsed)
            *min += pick(qSmartMinSize(s->widget));

        *max += pick(qSmartMaxSize(s->widget));
    }
}